

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O0

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* getPredefinedTransformations3L1Q<double>
            (vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             *__return_storage_ptr__,Matrix<double,_4,_1,_0,_4,_1> *P1,
            Matrix<double,_4,_1,_0,_4,_1> *P1_B)

{
  MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *this;
  Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> local_288 [56];
  DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> local_250 [56];
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
  local_218 [64];
  Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> local_1d8 [56];
  DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> local_1a0 [56];
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
  local_168 [64];
  undefined1 local_128 [8];
  Matrix<double,_4,_4,_0,_4,_4> transU_B;
  Matrix<double,_4,_4,_0,_4,_4> transU;
  Matrix<double,_4,_1,_0,_4,_1> *P1_B_local;
  Matrix<double,_4,_1,_0,_4,_1> *P1_local;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  *out;
  
  this = (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
         (transU_B.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array + 0xf);
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)this);
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)local_128);
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setIdentity(this,4,4);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)local_1a0,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)P1,3);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::operator-
            ((NegativeReturnType *)local_168,local_1a0);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
            ((Type *)local_1d8,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)this,3,1);
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=(local_1d8,local_168);
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_128,4,4);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)local_250,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)P1_B,3);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::operator-
            ((NegativeReturnType *)local_218,local_250);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
            ((Type *)local_288,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_128,3,1);
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=(local_288,local_218);
  std::
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ::vector(__return_storage_ptr__);
  std::
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)this);
  std::
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_128);
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 4,4>> getPredefinedTransformations3L1Q(
	Matrix<floatPrec, 4,1> P1, Matrix<floatPrec, 4,1> P1_B)
{

	// translate frames to P1 and P1_B
	Matrix<floatPrec, 4,4> transU, transU_B;
	transU.setIdentity(4,4);
	transU.topRightCorner(3, 1) = -P1.head(3);
	transU_B.setIdentity(4,4);
	transU_B.topRightCorner(3, 1) = -P1_B.head(3);

	vector<Matrix<floatPrec, 4,4>> out;
	out.push_back(transU);
	out.push_back(transU_B);

	return out;
}